

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.cpp
# Opt level: O3

int __thiscall dic::dictReplace(dic *this,int dictidx,dictEntry newde)

{
  int iVar1;
  pointer pdVar2;
  void *pvVar3;
  
  pdVar2 = (this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = pdVar2[dictidx].rehashidx;
  pvVar3 = dict_find(this,dictidx,0,newde.key);
  if (iVar1 == -1) {
    if (pvVar3 != (void *)0x0) goto LAB_00106dcd;
  }
  else {
    if (pvVar3 != (void *)0x0) {
LAB_00106dcd:
      *(anon_union_8_2_743ab2ba_for_v *)((long)pvVar3 + 8) = newde.v;
      return 1;
    }
    pvVar3 = dict_find(this,dictidx,1,newde.key);
    if (pvVar3 != (void *)0x0) {
      *(anon_union_8_2_743ab2ba_for_v *)((long)pvVar3 + 8) = newde.v;
      return 1;
    }
  }
  (pdVar2[dictidx].type)->hashFunction = murmurhash2;
  return -1;
}

Assistant:

int dic::dictReplace(int dictidx,dictEntry newde){
    dictEntry *fetch=NULL;
    if(dc[dictidx].rehashidx==-1){    
        fetch=(dictEntry *)dic::dict_find(dictidx,0,newde.key);
        if(fetch!=NULL){
            fetch->v.val=newde.v.val;
            return 1;
        }else{
            int index=dic::dictAdd(dictidx,newde.key,newde.v.val);
            return index; 
        }
    }
    else{
        fetch=(dictEntry *)dic::dict_find(dictidx,0,newde.key);
        if(fetch!=NULL){
            fetch->v.val=newde.v.val;
            return 1;
        } else if((fetch=(dictEntry *)dic::dict_find(dictidx,1,newde.key))!=NULL){
            fetch->v.val=newde.v.val;
            return 1;
        }
        return dic::dictAdd(dictidx,newde.key,newde.v.val);
    }
}